

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.hpp
# Opt level: O3

void czh::utils::grisu2(double v,string *buffer,int *K)

{
  long lVar1;
  undefined1 auVar2 [12];
  double dVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  undefined4 in_XMM0_Dc;
  DiyFp DVar8;
  DiyFp DVar9;
  DiyFp DVar10;
  DiyFp Mp;
  DiyFp local_90;
  tuple<czh::utils::DiyFp,_czh::utils::DiyFp> local_80;
  DiyFp local_60;
  DiyFp local_50;
  DiyFp local_40;
  
  auVar2._8_4_ = in_XMM0_Dc;
  auVar2._0_8_ = v;
  uVar7 = (uint)((ulong)v >> 0x34) & 0x7ff;
  uVar4 = (ulong)v & 0xfffffffffffff;
  uVar5 = uVar4 + 0x10000000000000;
  local_90.f = uVar5;
  if (uVar7 == 0) {
    local_90.f = uVar4;
  }
  iVar6 = uVar7 - 0x433;
  local_90.e = -0x432;
  if (uVar7 != 0) {
    local_90.e = iVar6;
  }
  DiyFp::normalized_boundaries(&local_80,&local_90);
  if (uVar7 == 0) {
    lVar1 = 0x3f;
    if ((auVar2 & (undefined1  [12])0xfffffffffffff) != (undefined1  [12])0x0) {
      for (; uVar4 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    uVar5 = uVar4 << (~(byte)lVar1 + 0x35 & 0x3f);
    iVar6 = ((uint)lVar1 ^ 0xffffffc0) - 0x426;
  }
  local_90.f = uVar5 << 0xb;
  local_90.e = iVar6 + -0xb;
  dVar3 = ceil((double)(-0x3c - local_80.
                                super__Tuple_impl<0UL,_czh::utils::DiyFp,_czh::utils::DiyFp>.
                                super__Tuple_impl<1UL,_czh::utils::DiyFp>.
                                super__Head_base<1UL,_czh::utils::DiyFp,_false>._M_head_impl.e) *
               0.30102999566398114);
  iVar6 = (int)dVar3;
  local_40.f = *(uint64_t *)(powers_ten + (long)iVar6 * 8 + 0xab8);
  local_40.e = *(int *)(powers_ten_e + (long)iVar6 * 4 + 0x55c);
  DVar8 = DiyFp::operator*(&local_90,&local_40);
  DVar9 = DiyFp::operator*((DiyFp *)&local_80,&local_40);
  local_50.e = DVar9.e;
  DVar10 = DiyFp::operator*(&local_80.super__Tuple_impl<0UL,_czh::utils::DiyFp,_czh::utils::DiyFp>.
                             super__Head_base<0UL,_czh::utils::DiyFp,_false>._M_head_impl,&local_40)
  ;
  local_60.e = DVar10.e;
  local_60.f = DVar10.f + 1;
  local_50.f = DVar9.f - 1;
  DVar9 = DiyFp::operator-(&local_50,&local_60);
  *K = -iVar6;
  Mp.e = local_50.e;
  Mp.f = local_50.f;
  DVar10._12_4_ = 0;
  DVar10.f = SUB128(DVar8._0_12_,0);
  DVar10.e = SUB124(DVar8._0_12_,8);
  Mp._12_4_ = 0;
  DVar8._8_8_ = K;
  DVar8.f = DVar9.f;
  digit_gen(DVar10,Mp,DVar8,buffer,K);
  return;
}

Assistant:

void grisu2(double v, std::string &buffer, int &K)
  {
    int q = 64, alpha = -59;
    auto[w_m, w_p] = DiyFp(v).normalized_boundaries();
    DiyFp w = DiyFp(v).normalize();
    int mk = k_comp(w_p.e + q, alpha);
    DiyFp c_mk = cached_power(mk);
    DiyFp W = w * c_mk;
    DiyFp Wp = w_p * c_mk;
    DiyFp Wm = w_m * c_mk;
    Wm.f++;
    Wp.f--;
    DiyFp delta = Wp - Wm;
    K = -mk;
    digit_gen(W, Wp, delta, buffer, K);
  }